

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

st_quicly_pn_space_t * alloc_pn_space(size_t sz,uint32_t packet_tolerance)

{
  uint32_t in_ESI;
  size_t in_RDI;
  st_quicly_pn_space_t *space;
  st_quicly_pn_space_t *local_8;
  
  local_8 = (st_quicly_pn_space_t *)malloc(in_RDI);
  if (local_8 == (st_quicly_pn_space_t *)0x0) {
    local_8 = (st_quicly_pn_space_t *)0x0;
  }
  else {
    quicly_ranges_init((quicly_ranges_t *)local_8);
    local_8->largest_pn_received_at = 0x7fffffffffffffff;
    local_8->next_expected_packet_number = 0;
    local_8->unacked_count = 0;
    local_8->packet_tolerance = in_ESI;
    local_8->ignore_order = '\0';
    if (in_RDI != 0x48) {
      memset(local_8 + 1,0,in_RDI - 0x48);
    }
  }
  return local_8;
}

Assistant:

static struct st_quicly_pn_space_t *alloc_pn_space(size_t sz, uint32_t packet_tolerance)
{
    struct st_quicly_pn_space_t *space;

    if ((space = malloc(sz)) == NULL)
        return NULL;

    quicly_ranges_init(&space->ack_queue);
    space->largest_pn_received_at = INT64_MAX;
    space->next_expected_packet_number = 0;
    space->unacked_count = 0;
    space->packet_tolerance = packet_tolerance;
    space->ignore_order = 0;
    if (sz != sizeof(*space))
        memset((uint8_t *)space + sizeof(*space), 0, sz - sizeof(*space));

    return space;
}